

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O2

QSize __thiscall QtMWidgets::PickerPrivate::sizeHint(PickerPrivate *this,QStyleOption *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int extraout_var;
  QSize QVar4;
  int extraout_var_00;
  QLatin1String latin1;
  QArrayDataPointer<char16_t> local_30;
  
  computeStringWidth(this);
  latin1.m_data = "A";
  latin1.m_size = 1;
  QString::QString((QString *)&local_30,latin1);
  QFontMetrics::boundingRect((QString *)(opt + 0x20));
  this->stringHeight = (extraout_var_00 - extraout_var) + 1;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_30);
  this->itemTopMargin = this->stringHeight / 3;
  iVar2 = QFontMetrics::averageCharWidth();
  this->itemSideMargin = iVar2 * 3;
  iVar1 = this->maxStringWidth;
  iVar3 = QFontMetrics::averageCharWidth();
  QVar4.wd = iVar2 * 6 + iVar1 + iVar3 * 2;
  QVar4.ht = (this->stringHeight + this->itemTopMargin) * this->itemsCount - this->itemTopMargin;
  return QVar4;
}

Assistant:

QSize
PickerPrivate::sizeHint( const QStyleOption & opt )
{
	computeStringWidth();

	stringHeight = opt.fontMetrics.boundingRect( QLatin1String( "A" ) ).height();

	itemTopMargin = stringHeight / 3;

	itemSideMargin = opt.fontMetrics.averageCharWidth() * 3;

	const int widgetWidth = maxStringWidth + 2 * itemSideMargin +
		2 * opt.fontMetrics.averageCharWidth();
	const int widgetHeight = ( stringHeight + itemTopMargin ) *
		itemsCount - itemTopMargin;

	return QSize( widgetWidth, widgetHeight );
}